

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3443.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellANCF_3443::ComputeInternalJacobianPreInt
          (ChElementShellANCF_3443 *this,ChMatrixRef *H,double Kfactor,double Rfactor)

{
  Matrix<double,__1,__1,_0,__1,__1> *a_rhs;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  PointerType pdVar5;
  long lVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double *pdVar11;
  char *__function;
  double *pdVar12;
  long lVar13;
  long lVar14;
  double *pdVar15;
  long lVar16;
  long lVar17;
  double *pdVar18;
  long lVar19;
  long lVar20;
  Index outer;
  long lVar21;
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined8 in_XMM0_Qb;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined8 in_XMM1_Qb;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  ChMatrixNM<double,_1,_NSF>_conflict3 tempRow2;
  ChMatrixNM<double,_1,_NSF>_conflict3 tempRow1;
  ChMatrixNM<double,_1,_NSF>_conflict3 tempRow0;
  Matrix3xN e_bar;
  Matrix3xN e_bar_dot;
  MatrixNxN K_K13Compact;
  ChMatrixNMc<double,_9,_NSF_*_NSF> K2;
  ChMatrixNMc<double,_9,_NSF_*_NSF> PI2;
  assign_op<double,_double> local_9d79;
  ChElementShellANCF_3443 *local_9d78;
  double *local_9d70;
  undefined8 uStack_9d68;
  double local_9d60;
  undefined8 uStack_9d58;
  plainobjectbase_evaluator_data<double,_16> local_9d50;
  Data local_9d48;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_16,_16,_1,_16,_16>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_9d20;
  undefined1 local_9d00 [64];
  undefined1 local_9cc0 [64];
  undefined1 local_9c80 [64];
  undefined1 local_9c40 [64];
  undefined1 local_9c00 [64];
  undefined1 local_9bc0 [64];
  undefined1 local_9b80 [128];
  undefined1 local_9b00 [64];
  undefined1 local_9ac0 [64];
  undefined1 local_9a80 [64];
  undefined1 local_9a40 [64];
  undefined1 local_9a00 [64];
  undefined1 local_99c0 [64];
  undefined1 local_9980 [64];
  undefined1 local_9940 [64];
  undefined1 local_9900 [64];
  undefined1 local_98c0 [64];
  DstXprType local_9880;
  Matrix<double,_9,_256,_0,_9,_256> local_9080;
  Matrix<double,_9,_256,_0,_9,_256> local_4880;
  
  local_9d70 = (double *)Rfactor;
  uStack_9d68 = in_XMM1_Qb;
  local_9d60 = Kfactor;
  uStack_9d58 = in_XMM0_Qb;
  CalcCoordMatrix(this,(Matrix3xN *)local_9b80);
  CalcCoordDerivMatrix(this,(Matrix3xN *)local_9a00);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = this->m_Alpha;
  auVar23._8_8_ = uStack_9d68;
  auVar23._0_8_ = local_9d70;
  auVar9._8_8_ = uStack_9d58;
  auVar9._0_8_ = local_9d60;
  auVar23 = vfmadd213sd_fma(auVar23,auVar28,auVar9);
  auVar24 = vbroadcastsd_avx512f(auVar23);
  auVar25 = vmulpd_avx512f(auVar24,local_9b80._0_64_);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = this->m_Alpha * local_9d60;
  auVar26 = vbroadcastsd_avx512f(auVar29);
  auVar27 = vmulpd_avx512f(auVar26,local_9a00);
  local_9c00 = vaddpd_avx512f(auVar25,auVar27);
  auVar25 = vmulpd_avx512f(auVar24,local_9b80._64_64_);
  auVar27 = vmulpd_avx512f(auVar26,local_99c0);
  local_9bc0 = vaddpd_avx512f(auVar25,auVar27);
  auVar25 = vmulpd_avx512f(auVar24,local_9b00);
  auVar27 = vmulpd_avx512f(auVar26,local_9980);
  local_9c80 = vaddpd_avx512f(auVar25,auVar27);
  auVar25 = vmulpd_avx512f(auVar24,local_9ac0);
  auVar27 = vmulpd_avx512f(auVar26,local_9940);
  local_9c40 = vaddpd_avx512f(auVar25,auVar27);
  auVar25 = vmulpd_avx512f(auVar24,local_9a80);
  auVar27 = vmulpd_avx512f(auVar26,local_9900);
  local_9d00 = vaddpd_avx512f(auVar25,auVar27);
  auVar24 = vmulpd_avx512f(auVar24,local_9a40);
  auVar25 = vmulpd_avx512f(auVar26,local_98c0);
  local_9cc0 = vaddpd_avx512f(auVar24,auVar25);
  pdVar11 = local_4880.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.
            m_data.array + 2;
  pdVar12 = local_4880.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.
            m_data.array + 5;
  pdVar15 = local_4880.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.
            m_data.array + 8;
  lVar16 = 0;
  do {
    dVar1 = *(double *)(local_9b80 + lVar16 * 8);
    dVar2 = *(double *)(local_9b00 + lVar16 * 8);
    dVar3 = *(double *)(local_9a80 + lVar16 * 8);
    lVar21 = 0;
    pdVar18 = local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.
              m_data.array + 2;
    do {
      dVar4 = *(double *)(local_9c00 + lVar21 * 8);
      ((plain_array<double,_2304,_0,_64> *)(pdVar18 + -2))->array[0] = dVar1 * dVar4;
      pdVar18[-1] = dVar2 * dVar4;
      *pdVar18 = dVar3 * dVar4;
      lVar21 = lVar21 + 1;
      pdVar18 = pdVar18 + 3;
    } while (lVar21 != 0x10);
    lVar21 = 0x10;
    pdVar18 = pdVar11;
    do {
      dVar4 = *(double *)
               ((long)local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.
                      m_storage.m_data.array + lVar21 + -8);
      ((plain_array<double,_2304,_0,_64> *)(pdVar18 + -2))->array[0] =
           *(double *)
            ((long)local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.
                   m_storage.m_data.array + lVar21 + -0x10);
      pdVar18[-1] = dVar4;
      *pdVar18 = *(double *)
                  ((long)local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>
                         .m_storage.m_data.array + lVar21);
      lVar21 = lVar21 + 0x18;
      pdVar18 = pdVar18 + 9;
    } while (lVar21 != 400);
    lVar21 = 0;
    pdVar18 = local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.
              m_data.array + 2;
    do {
      dVar4 = *(double *)(local_9c80 + lVar21 * 8);
      ((plain_array<double,_2304,_0,_64> *)(pdVar18 + -2))->array[0] = dVar1 * dVar4;
      pdVar18[-1] = dVar2 * dVar4;
      *pdVar18 = dVar3 * dVar4;
      lVar21 = lVar21 + 1;
      pdVar18 = pdVar18 + 3;
    } while (lVar21 != 0x10);
    lVar21 = 0x10;
    pdVar18 = pdVar12;
    do {
      dVar4 = *(double *)
               ((long)local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.
                      m_storage.m_data.array + lVar21 + -8);
      pdVar18[-2] = *(double *)
                     ((long)local_9080.
                            super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.
                            m_storage.m_data.array + lVar21 + -0x10);
      pdVar18[-1] = dVar4;
      *pdVar18 = *(double *)
                  ((long)local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>
                         .m_storage.m_data.array + lVar21);
      lVar21 = lVar21 + 0x18;
      pdVar18 = pdVar18 + 9;
    } while (lVar21 != 400);
    lVar21 = 0;
    pdVar18 = local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.
              m_data.array + 2;
    do {
      dVar4 = *(double *)(local_9d00 + lVar21 * 8);
      ((plain_array<double,_2304,_0,_64> *)(pdVar18 + -2))->array[0] = dVar1 * dVar4;
      pdVar18[-1] = dVar2 * dVar4;
      *pdVar18 = dVar3 * dVar4;
      lVar21 = lVar21 + 1;
      pdVar18 = pdVar18 + 3;
    } while (lVar21 != 0x10);
    lVar21 = 0x10;
    pdVar18 = pdVar15;
    do {
      dVar1 = *(double *)
               ((long)local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.
                      m_storage.m_data.array + lVar21 + -8);
      pdVar18[-2] = *(double *)
                     ((long)local_9080.
                            super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.
                            m_storage.m_data.array + lVar21 + -0x10);
      pdVar18[-1] = dVar1;
      *pdVar18 = *(double *)
                  ((long)local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>
                         .m_storage.m_data.array + lVar21);
      lVar21 = lVar21 + 0x18;
      pdVar18 = pdVar18 + 9;
    } while (lVar21 != 400);
    lVar16 = lVar16 + 1;
    pdVar11 = pdVar11 + 0x90;
    pdVar12 = pdVar12 + 0x90;
    pdVar15 = pdVar15 + 0x90;
  } while (lVar16 != 0x10);
  a_rhs = &this->m_O2;
  local_9880.super_PlainObjectBase<Eigen::Matrix<double,_16,_16,_1,_16,_16>_>.m_storage.m_data.array
  [0] = (double)&local_4880;
  local_9d78 = this;
  local_9880.super_PlainObjectBase<Eigen::Matrix<double,_16,_16,_1,_16,_16>_>.m_storage.m_data.array
  [2] = (double)a_rhs;
  if ((this->m_O2).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
      != 0x100) {
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                  "Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, 9, 256, 0>>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, 9, 256, 0>>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
                 );
  }
  if ((this->m_O2).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
      == 0x100) {
    lVar22 = 0;
    memset(&local_9080,0,0x4800);
    local_9d48._0_8_ = 0x3ff0000000000000;
    local_9d70 = (double *)&local_9880;
    Eigen::internal::
    generic_product_impl<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,9,256,0,9,256>const>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::scaleAndAddTo<Eigen::Matrix<double,9,256,0,9,256>>
              (&local_9080,
               (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_9,_256,_0,_9,_256>_>
                *)local_9d70,a_rhs,(Scalar *)&local_9d48);
    lVar16 = 8;
    lVar21 = 0x10;
    pdVar11 = local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.
              m_data.array + 8;
    lVar13 = 0;
    do {
      lVar14 = (H->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).m_stride.m_outer.m_value;
      pdVar5 = (H->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
               .
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_data;
      lVar6 = (H->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
              .m_rows.m_value;
      lVar17 = lVar14 * lVar22;
      lVar19 = lVar14 * lVar16;
      lVar14 = lVar14 * lVar21;
      lVar20 = 2;
      pdVar12 = pdVar11;
      do {
        if ((lVar6 < lVar13 * 3 + 3) ||
           ((H->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value <= lVar20 + -2)) {
LAB_00793dcd:
          __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                        ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,
                        "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 3, 1>::Block(XprType &, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
                       );
        }
        *(double *)((long)pdVar5 + lVar20 * 8 + lVar17 + -0x10) =
             ((plain_array<double,_2304,_0,_64> *)(pdVar12 + -8))->array[0];
        *(double *)((long)pdVar5 + lVar20 * 8 + lVar19 + -0x10) = pdVar12[-7];
        *(double *)((long)pdVar5 + lVar20 * 8 + lVar14 + -0x10) = pdVar12[-6];
        if ((H->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value <= lVar20 + -1) goto LAB_00793dcd;
        *(double *)((long)pdVar5 + lVar20 * 8 + lVar17 + -8) = pdVar12[-5];
        *(double *)((long)pdVar5 + lVar20 * 8 + lVar19 + -8) = pdVar12[-4];
        *(double *)((long)pdVar5 + lVar20 * 8 + lVar14 + -8) = pdVar12[-3];
        if ((H->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value <= lVar20) goto LAB_00793dcd;
        *(double *)((long)pdVar5 + lVar20 * 8 + lVar17) = pdVar12[-2];
        *(double *)((long)pdVar5 + lVar20 * 8 + lVar19) = pdVar12[-1];
        *(double *)((long)pdVar5 + lVar20 * 8 + lVar14) = *pdVar12;
        lVar20 = lVar20 + 3;
        pdVar12 = pdVar12 + 0x90;
      } while (lVar20 != 0x32);
      lVar13 = lVar13 + 1;
      lVar22 = lVar22 + 0x18;
      lVar16 = lVar16 + 0x18;
      lVar21 = lVar21 + 0x18;
      pdVar11 = pdVar11 + 9;
    } while (lVar13 != 0x10);
    local_9d48.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
    m_outerStride =
         (local_9d78->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
         .m_storage.m_rows;
    uVar7 = (local_9d78->m_K13Compact).
            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
    if ((long)(uVar7 | local_9d48.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                       .
                       super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                       .m_d.m_outerStride) < 0) {
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1>]"
                   );
    }
    if ((local_9d48.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
         super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
         m_outerStride == 0x10) && (uVar7 == 0x10)) {
      auVar10._8_8_ = uStack_9d58;
      auVar10._0_8_ = local_9d60;
      auVar8._8_8_ = 0x8000000000000000;
      auVar8._0_8_ = 0x8000000000000000;
      auVar23 = vxorpd_avx512vl(auVar10,auVar8);
      local_9d48.lhsImpl.
      super_evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
      .m_functor.m_other = auVar23._0_8_;
      local_9d48.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.data =
           (local_9d78->m_K13Compact).
           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
      local_9d20.m_dst = (DstEvaluatorType *)&local_9d50;
      local_9d50.data = (double *)&local_9880;
      local_9d20.m_src = (SrcEvaluatorType *)&local_9d48;
      local_9d20.m_functor = &local_9d79;
      local_9d20.m_dstExpr = (DstXprType *)local_9d50.data;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_16,_16,_1,_16,_16>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_1>
      ::run(&local_9d20);
      lVar16 = (H->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
               .
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_rows.m_value;
      local_9d78 = (ChElementShellANCF_3443 *)0x10;
      lVar21 = 8;
      lVar13 = 0;
      lVar22 = 0;
      while (lVar22 * 3 < lVar16) {
        pdVar5 = (H->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                 .
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 .m_data;
        lVar14 = (H->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                 .
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 .m_cols.m_value;
        lVar6 = (H->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).m_stride.m_outer.m_value;
        lVar17 = 2;
        pdVar11 = local_9d70;
        do {
          if ((((lVar14 <= lVar17 + -2) ||
               (*(double *)((long)pdVar5 + lVar17 * 8 + lVar6 * lVar13 + -0x10) =
                     *pdVar11 + *(double *)((long)pdVar5 + lVar17 * 8 + lVar6 * lVar13 + -0x10),
               lVar16 <= lVar22 * 3 + 1)) || (lVar14 <= lVar17 + -1)) ||
             ((*(double *)((long)pdVar5 + lVar17 * 8 + lVar6 * lVar21 + -8) =
                    *pdVar11 + *(double *)((long)pdVar5 + lVar17 * 8 + lVar6 * lVar21 + -8),
              lVar16 <= lVar22 * 3 + 2 || (lVar14 <= lVar17)))) goto LAB_00793dae;
          *(double *)((long)pdVar5 + lVar17 * 8 + lVar6 * (long)local_9d78) =
               *pdVar11 + *(double *)((long)pdVar5 + lVar17 * 8 + lVar6 * (long)local_9d78);
          lVar17 = lVar17 + 3;
          pdVar11 = pdVar11 + 1;
        } while (lVar17 != 0x32);
        lVar22 = lVar22 + 1;
        local_9d78 = (ChElementShellANCF_3443 *)((long)local_9d78 + 0x18);
        lVar21 = lVar21 + 0x18;
        lVar13 = lVar13 + 0x18;
        local_9d70 = local_9d70 + 0x10;
        if (lVar22 == 0x10) {
          return;
        }
      }
LAB_00793dae:
      __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 1>::operator()(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 1]"
                   );
    }
    __function = 
    "void Eigen::PlainObjectBase<Eigen::Matrix<double, 16, 16, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 16, 16, 1>]"
    ;
  }
  else {
    __function = 
    "void Eigen::PlainObjectBase<Eigen::Matrix<double, 9, 256, 0>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 9, 256, 0>]"
    ;
  }
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,__function);
}

Assistant:

void ChElementShellANCF_3443::ComputeInternalJacobianPreInt(ChMatrixRef& H, double Kfactor, double Rfactor) {
    // Calculate the Jacobian of the generalize internal force vector using the "Pre-Integration" style of method
    // assuming a linear viscoelastic material model (single term damping model).  For this style of method, the
    // components of the generalized internal force vector and its Jacobian that need to be integrated across the volume
    // are calculated once prior to the start of the simulation.  This makes this method well suited for applications
    // with many discrete layers since the in-simulation calculations are independent of the number of Gauss quadrature
    // points used throughout the entire element.  Since computationally expensive quantities are required for both the
    // generalized internal force vector and its Jacobian, these values were cached for reuse during this Jacobian
    // calculation.

    Matrix3xN e_bar;
    Matrix3xN e_bar_dot;

    CalcCoordMatrix(e_bar);
    CalcCoordDerivMatrix(e_bar_dot);

    // Build the [9 x NSF^2] matrix containing the combined scaled nodal coordinates and their time derivatives.
    Matrix3xN temp = (Kfactor + m_Alpha * Rfactor) * e_bar + (m_Alpha * Kfactor) * e_bar_dot;
    ChMatrixNM<double, 1, NSF> tempRow0 = temp.template block<1, NSF>(0, 0);
    ChMatrixNM<double, 1, NSF> tempRow1 = temp.template block<1, NSF>(1, 0);
    ChMatrixNM<double, 1, NSF> tempRow2 = temp.template block<1, NSF>(2, 0);
    ChMatrixNMc<double, 9, NSF * NSF> PI2;

    for (unsigned int v = 0; v < NSF; v++) {
        PI2.template block<3, NSF>(0, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow0;
        PI2.template block<3, NSF>(3, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow1;
        PI2.template block<3, NSF>(6, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow2;
    }

    // Calculate the matrix containing the dense part of the Jacobian matrix in a reordered form. This is then reordered
    // from its [9 x NSF^2] form into its required [3*NSF x 3*NSF] form
    ChMatrixNMc<double, 9, NSF* NSF> K2 = -PI2 * m_O2;

    for (unsigned int k = 0; k < NSF; k++) {
        for (unsigned int f = 0; f < NSF; f++) {
            H.block<3, 1>(3 * k, 3 * f) = K2.template block<3, 1>(0, NSF * f + k);
            H.block<3, 1>(3 * k, 3 * f + 1) = K2.template block<3, 1>(3, NSF * f + k);
            H.block<3, 1>(3 * k, 3 * f + 2) = K2.template block<3, 1>(6, NSF * f + k);
        }
    }

    // Add in the sparse (blocks times the 3x3 identity matrix) component of the Jacobian that was already calculated as
    // part of the generalized internal force calculations
    MatrixNxN K_K13Compact = -Kfactor * m_K13Compact;
    for (unsigned int i = 0; i < NSF; i++) {
        for (unsigned int j = 0; j < NSF; j++) {
            H(3 * i, 3 * j) += K_K13Compact(i, j);
            H(3 * i + 1, 3 * j + 1) += K_K13Compact(i, j);
            H(3 * i + 2, 3 * j + 2) += K_K13Compact(i, j);
        }
    }
}